

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeSorterWrite(VdbeCursor *pCsr,Mem *pVal)

{
  int iVar1;
  int iVar2;
  u8 *puVar3;
  bool local_6f;
  bool local_6e;
  bool local_6d;
  int local_64;
  u64 uStack_60;
  int iListOff;
  sqlite3_int64 nNew;
  u8 *aNew;
  uint local_48;
  int nMin;
  int t;
  int nPMA;
  int nReq;
  int bFlush;
  SorterRecord *pNew;
  VdbeSorter *pVStack_28;
  int rc;
  VdbeSorter *pSorter;
  Mem *pVal_local;
  VdbeCursor *pCsr_local;
  
  pNew._4_4_ = 0;
  pVStack_28 = (pCsr->uc).pSorter;
  pSorter = (VdbeSorter *)pVal;
  pVal_local = (Mem *)pCsr;
  if ((byte)pVal->z[1] < 0x80) {
    local_48 = (uint)(byte)pVal->z[1];
  }
  else {
    sqlite3GetVarint32((uchar *)(pVal->z + 1),&local_48);
  }
  if ((((int)local_48 < 1) || (9 < (int)local_48)) || (local_48 == 7)) {
    if (((int)local_48 < 0xb) || ((local_48 & 1) == 0)) {
      pVStack_28->typeMask = '\0';
    }
    else {
      pVStack_28->typeMask = pVStack_28->typeMask & 2;
    }
  }
  else {
    pVStack_28->typeMask = pVStack_28->typeMask & 1;
  }
  t = pSorter->pgsz + 0x10;
  iVar2 = pSorter->pgsz;
  iVar1 = sqlite3VarintLen((long)pSorter->pgsz);
  nMin = iVar2 + iVar1;
  if (pVStack_28->mxPmaSize != 0) {
    if ((pVStack_28->list).aMemory == (u8 *)0x0) {
      local_6e = true;
      if (((pVStack_28->list).szPMA <= pVStack_28->mxPmaSize) &&
         (local_6f = false, local_6e = local_6f, pVStack_28->mnPmaSize < (pVStack_28->list).szPMA))
      {
        iVar2 = sqlite3HeapNearlyFull();
        local_6e = iVar2 != 0;
      }
    }
    else {
      local_6d = false;
      local_6e = local_6d;
      if (pVStack_28->iMemory != 0) {
        local_6e = pVStack_28->mxPmaSize < pVStack_28->iMemory + t;
      }
    }
    nPMA = (int)local_6e;
    if (nPMA != 0) {
      pNew._4_4_ = vdbeSorterFlushPMA(pVStack_28);
      (pVStack_28->list).szPMA = 0;
      pVStack_28->iMemory = 0;
    }
  }
  (pVStack_28->list).szPMA = nMin + (pVStack_28->list).szPMA;
  if (pVStack_28->mxKeysize < nMin) {
    pVStack_28->mxKeysize = nMin;
  }
  if ((pVStack_28->list).aMemory == (u8 *)0x0) {
    _nReq = (SorterRecord *)sqlite3Malloc((long)t);
    if (_nReq == (SorterRecord *)0x0) {
      return 7;
    }
    _nReq->u = (anon_union_8_2_0134e7e8_for_u)(pVStack_28->list).pList;
  }
  else {
    iVar2 = pVStack_28->iMemory + t;
    if (pVStack_28->nMemory < iVar2) {
      uStack_60 = (u64)pVStack_28->nMemory;
      local_64 = -1;
      if ((pVStack_28->list).pList != (SorterRecord *)0x0) {
        local_64 = (int)(pVStack_28->list).pList - (int)(pVStack_28->list).aMemory;
      }
      do {
        uStack_60 = uStack_60 << 1;
      } while ((long)uStack_60 < (long)iVar2);
      if ((long)pVStack_28->mxPmaSize < (long)uStack_60) {
        uStack_60 = (u64)pVStack_28->mxPmaSize;
      }
      if ((long)uStack_60 < (long)iVar2) {
        uStack_60 = (u64)iVar2;
      }
      puVar3 = (u8 *)sqlite3Realloc((pVStack_28->list).aMemory,uStack_60);
      if (puVar3 == (u8 *)0x0) {
        return 7;
      }
      if (-1 < local_64) {
        (pVStack_28->list).pList = (SorterRecord *)(puVar3 + local_64);
      }
      (pVStack_28->list).aMemory = puVar3;
      pVStack_28->nMemory = (int)uStack_60;
    }
    _nReq = (SorterRecord *)((pVStack_28->list).aMemory + pVStack_28->iMemory);
    pVStack_28->iMemory = (t + 7U & 0xfffffff8) + pVStack_28->iMemory;
    if ((pVStack_28->list).pList != (SorterRecord *)0x0) {
      (_nReq->u).iNext = (int)(pVStack_28->list).pList - (int)(pVStack_28->list).aMemory;
    }
  }
  memcpy(_nReq + 1,pSorter->pReader,(long)pSorter->pgsz);
  _nReq->nVal = pSorter->pgsz;
  (pVStack_28->list).pList = _nReq;
  return pNew._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeSorterWrite(
  const VdbeCursor *pCsr,         /* Sorter cursor */
  Mem *pVal                       /* Memory cell containing record */
){
  VdbeSorter *pSorter;
  int rc = SQLITE_OK;             /* Return Code */
  SorterRecord *pNew;             /* New list element */
  int bFlush;                     /* True to flush contents of memory to PMA */
  int nReq;                       /* Bytes of memory required */
  int nPMA;                       /* Bytes of PMA space required */
  int t;                          /* serial type of first record field */

  assert( pCsr->eCurType==CURTYPE_SORTER );
  pSorter = pCsr->uc.pSorter;
  getVarint32((const u8*)&pVal->z[1], t);
  if( t>0 && t<10 && t!=7 ){
    pSorter->typeMask &= SORTER_TYPE_INTEGER;
  }else if( t>10 && (t & 0x01) ){
    pSorter->typeMask &= SORTER_TYPE_TEXT;
  }else{
    pSorter->typeMask = 0;
  }

  assert( pSorter );

  /* Figure out whether or not the current contents of memory should be
  ** flushed to a PMA before continuing. If so, do so.
  **
  ** If using the single large allocation mode (pSorter->aMemory!=0), then
  ** flush the contents of memory to a new PMA if (a) at least one value is
  ** already in memory and (b) the new value will not fit in memory.
  ** 
  ** Or, if using separate allocations for each record, flush the contents
  ** of memory to a PMA if either of the following are true:
  **
  **   * The total memory allocated for the in-memory list is greater 
  **     than (page-size * cache-size), or
  **
  **   * The total memory allocated for the in-memory list is greater 
  **     than (page-size * 10) and sqlite3HeapNearlyFull() returns true.
  */
  nReq = pVal->n + sizeof(SorterRecord);
  nPMA = pVal->n + sqlite3VarintLen(pVal->n);
  if( pSorter->mxPmaSize ){
    if( pSorter->list.aMemory ){
      bFlush = pSorter->iMemory && (pSorter->iMemory+nReq) > pSorter->mxPmaSize;
    }else{
      bFlush = (
          (pSorter->list.szPMA > pSorter->mxPmaSize)
       || (pSorter->list.szPMA > pSorter->mnPmaSize && sqlite3HeapNearlyFull())
      );
    }
    if( bFlush ){
      rc = vdbeSorterFlushPMA(pSorter);
      pSorter->list.szPMA = 0;
      pSorter->iMemory = 0;
      assert( rc!=SQLITE_OK || pSorter->list.pList==0 );
    }
  }

  pSorter->list.szPMA += nPMA;
  if( nPMA>pSorter->mxKeysize ){
    pSorter->mxKeysize = nPMA;
  }

  if( pSorter->list.aMemory ){
    int nMin = pSorter->iMemory + nReq;

    if( nMin>pSorter->nMemory ){
      u8 *aNew;
      sqlite3_int64 nNew = 2 * (sqlite3_int64)pSorter->nMemory;
      int iListOff = -1;
      if( pSorter->list.pList ){
        iListOff = (u8*)pSorter->list.pList - pSorter->list.aMemory;
      }
      while( nNew < nMin ) nNew = nNew*2;
      if( nNew > pSorter->mxPmaSize ) nNew = pSorter->mxPmaSize;
      if( nNew < nMin ) nNew = nMin;
      aNew = sqlite3Realloc(pSorter->list.aMemory, nNew);
      if( !aNew ) return SQLITE_NOMEM_BKPT;
      if( iListOff>=0 ){
        pSorter->list.pList = (SorterRecord*)&aNew[iListOff];
      }
      pSorter->list.aMemory = aNew;
      pSorter->nMemory = nNew;
    }

    pNew = (SorterRecord*)&pSorter->list.aMemory[pSorter->iMemory];
    pSorter->iMemory += ROUND8(nReq);
    if( pSorter->list.pList ){
      pNew->u.iNext = (int)((u8*)(pSorter->list.pList) - pSorter->list.aMemory);
    }
  }else{
    pNew = (SorterRecord *)sqlite3Malloc(nReq);
    if( pNew==0 ){
      return SQLITE_NOMEM_BKPT;
    }
    pNew->u.pNext = pSorter->list.pList;
  }

  memcpy(SRVAL(pNew), pVal->z, pVal->n);
  pNew->nVal = pVal->n;
  pSorter->list.pList = pNew;

  return rc;
}